

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O1

FT_Error ft_glyphslot_alloc_bitmap(FT_GlyphSlot slot,FT_ULong size)

{
  uint uVar1;
  FT_Memory pFVar2;
  uchar *puVar3;
  int iVar4;
  
  pFVar2 = slot->face->memory;
  uVar1 = slot->internal->flags;
  if ((uVar1 & 1) == 0) {
    slot->internal->flags = uVar1 | 1;
  }
  else {
    puVar3 = (slot->bitmap).buffer;
    if (puVar3 != (uchar *)0x0) {
      (*pFVar2->free)(pFVar2,puVar3);
    }
    (slot->bitmap).buffer = (uchar *)0x0;
  }
  if ((long)size < 1) {
    puVar3 = (uchar *)0x0;
    iVar4 = 6;
    if (size == 0) {
      iVar4 = 0;
    }
  }
  else {
    puVar3 = (uchar *)(*pFVar2->alloc)(pFVar2,size);
    iVar4 = (uint)(puVar3 == (uchar *)0x0) << 6;
  }
  if ((0 < (long)size) && (iVar4 == 0)) {
    memset(puVar3,0,size);
  }
  (slot->bitmap).buffer = puVar3;
  return iVar4;
}

Assistant:

FT_BASE_DEF( FT_Error )
  ft_glyphslot_alloc_bitmap( FT_GlyphSlot  slot,
                             FT_ULong      size )
  {
    FT_Memory  memory = FT_FACE_MEMORY( slot->face );
    FT_Error   error;


    if ( slot->internal->flags & FT_GLYPH_OWN_BITMAP )
      FT_FREE( slot->bitmap.buffer );
    else
      slot->internal->flags |= FT_GLYPH_OWN_BITMAP;

    (void)FT_ALLOC( slot->bitmap.buffer, size );
    return error;
  }